

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O1

string * ZXing::OneD::DecodeCode39AndCode93FullASCII
                   (string *__return_storage_ptr__,string *encoded,char *ctrl)

{
  byte bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  byte *pbVar7;
  byte bVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  pbVar7 = (byte *)(encoded->_M_dataplus)._M_p;
  pbVar9 = pbVar7;
  if (encoded->_M_string_length != 0) {
    pbVar10 = pbVar7;
    do {
      bVar8 = *pbVar10;
      pcVar6 = strchr(ctrl,(int)(char)bVar8);
      if (pcVar6 != (char *)0x0) {
        bVar3 = pbVar10[1];
        bVar1 = bVar3 + 0xbf;
        if (bVar1 < 0x1a) {
          if (bVar8 == *ctrl) {
            bVar8 = bVar3 - 0x40;
          }
          else if (bVar8 == ctrl[1]) {
            bVar8 = PERCENTAGE_MAPPING[bVar1];
          }
          else if (bVar8 == ctrl[2]) {
            bVar8 = bVar3 - 0x20;
          }
          else {
            bVar8 = bVar3 | 0x20;
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        if (0x19 < bVar1) {
          return __return_storage_ptr__;
        }
        pbVar10 = pbVar10 + 1;
      }
      *pbVar9 = bVar8;
      pbVar9 = pbVar9 + 1;
      pbVar10 = pbVar10 + 1;
      pbVar7 = (byte *)(encoded->_M_dataplus)._M_p;
    } while (pbVar10 != pbVar7 + encoded->_M_string_length);
  }
  encoded->_M_string_length = (long)pbVar9 - (long)pbVar7;
  *pbVar9 = 0;
  pcVar4 = (encoded->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar2 = &encoded->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&encoded->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = encoded->_M_string_length;
  (encoded->_M_dataplus)._M_p = (pointer)paVar2;
  encoded->_M_string_length = 0;
  (encoded->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string DecodeCode39AndCode93FullASCII(std::string encoded, const char ctrl[4])
{
	auto out = encoded.begin();
	for (auto in = encoded.cbegin(); in != encoded.cend(); ++in) {
		char c = *in;
		if (Contains(ctrl, c)) {
			char next = *++in; // if in is one short of cend(), then next == 0
			if (next < 'A' || next > 'Z')
				return {};
			if (c == ctrl[0])
				c = next - 64; // $A to $Z map to control codes SH to SB
			else if (c == ctrl[1])
				c = PERCENTAGE_MAPPING[next - 'A'];
			else if (c == ctrl[2])
				c = next - 32; // /A to /O map to ! to , and /Z maps to :
			else
				c = next + 32; // +A to +Z map to a to z
		}
		*out++ = c;
	}
	encoded.erase(out, encoded.end());
	return encoded;
}